

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

string * hmac_hash::sha1(string *input)

{
  uchar *puVar1;
  size_t length;
  uchar *in_RCX;
  allocator *md;
  size_t n;
  size_t n_00;
  EVP_PKEY_CTX *ctx_00;
  allocator local_c9;
  ulong local_c8;
  size_t i;
  uchar local_b8 [8];
  char buf [41];
  undefined1 local_78 [8];
  SHA1 ctx;
  byte local_38 [8];
  uint8_t digest [20];
  string *input_local;
  
  ctx_00 = (EVP_PKEY_CTX *)(digest + 0xc);
  ctx.m_buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::fill<unsigned_char*,char>
            (local_38,(uchar *)ctx_00,
             (char *)((long)&ctx.m_buffer.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  SHA1::SHA1((SHA1 *)local_78,(uchar *)ctx_00,n,in_RCX);
  SHA1::init((SHA1 *)local_78,ctx_00);
  puVar1 = (uchar *)std::__cxx11::string::c_str();
  length = std::__cxx11::string::length();
  SHA1::update((SHA1 *)local_78,puVar1,length);
  SHA1::finish((SHA1 *)local_78,local_38);
  i._7_1_ = 0;
  std::fill<char*,char>((char *)local_b8,buf + 0x21,(char *)((long)&i + 7));
  for (local_c8 = 0; local_c8 < 0x14; local_c8 = local_c8 + 1) {
    sprintf((char *)(local_b8 + local_c8 * 2),"%02x",(ulong)local_38[local_c8]);
  }
  md = &local_c9;
  std::allocator<char>::allocator();
  puVar1 = local_b8;
  std::__cxx11::string::string((string *)input,(char *)puVar1,0x28,md);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  SHA1::~SHA1((SHA1 *)local_78,puVar1,n_00,(uchar *)md);
  return input;
}

Assistant:

std::string sha1(const std::string &input) {
        uint8_t digest[hmac_hash::SHA1::DIGEST_SIZE];
        std::fill(digest, digest + hmac_hash::SHA1::DIGEST_SIZE, '\0');

        hmac_hash::SHA1 ctx;
        ctx.init();
        ctx.update((uint8_t*)input.c_str(), input.length());
        ctx.finish(digest);

        char buf[2 * hmac_hash::SHA1::DIGEST_SIZE + 1];
        std::fill(buf, buf + (2 * hmac_hash::SHA1::DIGEST_SIZE + 1), '\0');
        for(size_t i = 0; i < hmac_hash::SHA1::DIGEST_SIZE; ++i) {
            sprintf(buf + i * 2, "%02x", digest[i]);
        }
        return std::string(buf, (2 * hmac_hash::SHA1::DIGEST_SIZE));
    }